

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

UBool __thiscall icu_63::AndConstraint::isFulfilled(AndConstraint *this,IFixedDecimal *number)

{
  UVector32 *pUVar1;
  PluralOperand PVar2;
  bool bVar3;
  long lVar4;
  double x;
  double dVar5;
  double dVar6;
  
  if (this->digitsType == none) {
    return '\x01';
  }
  PVar2 = tokenTypeToPluralOperand(this->digitsType);
  (*number->_vptr_IFixedDecimal[2])(number,(ulong)PVar2);
  if (this->integerOnly == '\0') {
LAB_002784a2:
    dVar5 = x;
    if (this->op == MOD) {
      dVar5 = std::fmod<double,int>(x,this->opNum);
    }
    pUVar1 = this->rangeList;
    if (pUVar1 == (UVector32 *)0x0) {
      bVar3 = dVar5 == (double)this->value || this->value == -1;
      goto LAB_0027851e;
    }
    for (lVar4 = 1; lVar4 + -1 < (long)pUVar1->count; lVar4 = lVar4 + 2) {
      if ((double)pUVar1->elements[lVar4 + -1] <= dVar5) {
        dVar6 = 0.0;
        if (lVar4 < pUVar1->count) {
          dVar6 = (double)pUVar1->elements[lVar4];
        }
        if (dVar5 <= dVar6) {
          bVar3 = true;
          goto LAB_0027851e;
        }
      }
    }
  }
  else {
    dVar5 = uprv_floor_63(x);
    if ((x == dVar5) && (!NAN(x) && !NAN(dVar5))) goto LAB_002784a2;
  }
  bVar3 = false;
LAB_0027851e:
  return this->negated != '\0' ^ bVar3;
}

Assistant:

UBool
AndConstraint::isFulfilled(const IFixedDecimal &number) {
    UBool result = TRUE;
    if (digitsType == none) {
        // An empty AndConstraint, created by a rule with a keyword but no following expression.
        return TRUE;
    }

    PluralOperand operand = tokenTypeToPluralOperand(digitsType);
    double n = number.getPluralOperand(operand);     // pulls n | i | v | f value for the number.
                                                     // Will always be positive.
                                                     // May be non-integer (n option only)
    do {
        if (integerOnly && n != uprv_floor(n)) {
            result = FALSE;
            break;
        }

        if (op == MOD) {
            n = fmod(n, opNum);
        }
        if (rangeList == nullptr) {
            result = value == -1 ||    // empty rule
                     n == value;       //  'is' rule
            break;
        }
        result = FALSE;                // 'in' or 'within' rule
        for (int32_t r=0; r<rangeList->size(); r+=2) {
            if (rangeList->elementAti(r) <= n && n <= rangeList->elementAti(r+1)) {
                result = TRUE;
                break;
            }
        }
    } while (FALSE);

    if (negated) {
        result = !result;
    }
    return result;
}